

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cpp
# Opt level: O2

string * __thiscall
spvtools::ExtensionSetToString_abi_cxx11_
          (string *__return_storage_ptr__,spvtools *this,ExtensionSet *extensions)

{
  long lVar1;
  long lVar2;
  Extension extension;
  char *pcVar3;
  ostream *poVar4;
  ExtensionSet *__range1;
  iterator __begin1;
  stringstream ss;
  iterator local_1d0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  EnumSet<spvtools::Extension>::cbegin(&local_1d0,(EnumSet<spvtools::Extension> *)this);
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)this;
  while (((local_1d0.set_ != (EnumSet<spvtools::Extension> *)this || (local_1d0.bucketOffset_ != 0))
         || (local_1d0.bucketIndex_ != lVar1 - lVar2 >> 4))) {
    extension = EnumSet<spvtools::Extension>::Iterator::operator*(&local_1d0);
    pcVar3 = ExtensionToString(extension);
    poVar4 = std::operator<<(local_1a8,pcVar3);
    std::operator<<(poVar4," ");
    EnumSet<spvtools::Extension>::Iterator::operator++(&local_1d0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string ExtensionSetToString(const ExtensionSet& extensions) {
  std::stringstream ss;
  for (auto extension : extensions) {
    ss << ExtensionToString(extension) << " ";
  }
  return ss.str();
}